

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ircbot.cpp
# Opt level: O3

int __thiscall ircBot::speak(ircBot *this,char *fmt,...)

{
  int __fd;
  char in_AL;
  size_t __n;
  ssize_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list list;
  char k [1000];
  char Amsg [1000];
  undefined8 local_8c8;
  void **local_8c0;
  undefined1 *local_8b8;
  undefined1 local_8a8 [16];
  undefined8 local_898;
  undefined8 local_890;
  undefined8 local_888;
  undefined8 local_880;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined8 local_848;
  undefined8 local_838;
  undefined8 local_828;
  undefined8 local_818;
  undefined8 local_808;
  char local_7f8 [1008];
  char local_408 [1008];
  
  local_8b8 = local_8a8;
  if (in_AL != '\0') {
    local_878 = in_XMM0_Qa;
    local_868 = in_XMM1_Qa;
    local_858 = in_XMM2_Qa;
    local_848 = in_XMM3_Qa;
    local_838 = in_XMM4_Qa;
    local_828 = in_XMM5_Qa;
    local_818 = in_XMM6_Qa;
    local_808 = in_XMM7_Qa;
  }
  local_8c0 = &list[0].overflow_arg_area;
  local_8c8 = 0x3000000010;
  local_898 = in_RDX;
  local_890 = in_RCX;
  local_888 = in_R8;
  local_880 = in_R9;
  vsnprintf(local_7f8,1000,fmt,&local_8c8);
  snprintf(local_408,1000,"PRIVMSG %s :%s\r\n",ircchan,local_7f8);
  __fd = this->sock;
  __n = strlen(local_408);
  sVar1 = send(__fd,local_408,__n,0);
  return (int)sVar1;
}

Assistant:

int ircBot::speak(const char *fmt, ...){
    char Amsg[1000], k[1000];
    va_list list;
    va_start(list,fmt);
    vsnprintf(k,1000,fmt,list);
    snprintf(Amsg,1000,"PRIVMSG %s :%s\r\n", ircchan, k);
    va_end(list);
    
    return send(sock,Amsg,strlen(Amsg),0);
}